

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHuf.cpp
# Opt level: O2

void anon_unknown.dwarf_13f21e::compressUncompress(unsigned_short *raw,int n)

{
  unsigned_short *puVar1;
  unsigned_short *puVar2;
  int iVar3;
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  Array<char> compressed;
  Array<unsigned_short> uncompressed;
  
  uVar5 = (ulong)(n * 3 + 0x40000);
  compressed._data = (char *)operator_new__(uVar5);
  compressed._size = uVar5;
  Imf_3_2::Array<unsigned_short>::Array(&uncompressed,(ulong)(uint)n);
  std::operator<<((ostream *)&std::cout,"compressing ");
  std::ostream::flush();
  iVar3 = Imf_3_2::hufCompress(raw,n,compressed._data);
  std::operator<<((ostream *)&std::cout,"uncompressing ");
  std::ostream::flush();
  Imf_3_2::hufUncompress(compressed._data,iVar3,uncompressed._data,n);
  std::operator<<((ostream *)&std::cout,"comparing: ");
  std::ostream::flush();
  uVar5 = 0;
  uVar6 = (ulong)(uint)n;
  if (n < 1) {
    uVar6 = uVar5;
  }
  do {
    if (uVar6 == uVar5) {
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      poVar4 = std::operator<<(poVar4," bytes, compressed ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
      poVar4 = std::operator<<(poVar4," bytes");
      std::endl<char,std::char_traits<char>>(poVar4);
      Imf_3_2::Array<unsigned_short>::~Array(&uncompressed);
      Imf_3_2::Array<char>::~Array(&compressed);
      return;
    }
    puVar1 = uncompressed._data + uVar5;
    puVar2 = raw + uVar5;
    uVar5 = uVar5 + 1;
  } while (*puVar1 == *puVar2);
  __assert_fail("uncompressed[i] == raw[i]",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testHuf.cpp"
                ,99,"void (anonymous namespace)::compressUncompress(const unsigned short *, int)");
}

Assistant:

void
compressUncompress (const unsigned short raw[], int n)
{
    Array<char>           compressed (3 * n + 4 * 65536);
    Array<unsigned short> uncompressed (n);

    cout << "compressing " << flush;

    int nCompressed = hufCompress (raw, n, compressed);

    cout << "uncompressing " << flush;

    hufUncompress (compressed, nCompressed, uncompressed, n);

    cout << "comparing: " << flush;

    for (int i = 0; i < n; ++i)
        assert (uncompressed[i] == raw[i]);

    cout << sizeof (raw[0]) * n << " bytes, compressed " << nCompressed
         << " bytes" << endl;
}